

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9GroupProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nGroupSize;
  Vec_Int_t *__ptr;
  char *pcVar2;
  int iVar3;
  uint local_44;
  char *local_40;
  
  local_40 = (char *)0x0;
  Extra_UtilGetoptReset();
  nGroupSize = 1;
  local_44 = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"GSvh"), iVar3 = globalUtilOptind, iVar1 != 0x47) {
      if (iVar1 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          pcVar2 = "Abc_CommandAbc9GroupProve(): There is no AIG.\n";
        }
        else {
          if (local_40 != (char *)0x0) {
            __ptr = Gia_ManGroupProve(pAbc->pGia,local_40,nGroupSize,local_44);
            if (__ptr->pArray != (int *)0x0) {
              free(__ptr->pArray);
            }
            free(__ptr);
            return 0;
          }
          pcVar2 = "Abc_CommandAbc9GroupProve(): Command line is not given.\n";
        }
        iVar3 = -1;
        goto LAB_0028b167;
      }
      if (iVar1 == 0x53) {
        if (argc <= globalUtilOptind) {
          pcVar2 = "Command line switch \"-S\" should be followed by a file name.\n";
          goto LAB_0028b0b1;
        }
        local_40 = argv[globalUtilOptind];
        globalUtilOptind = globalUtilOptind + 1;
      }
      else if (iVar1 != 0x76) goto LAB_0028b0bd;
      local_44 = local_44 ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    nGroupSize = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)nGroupSize < 1) {
LAB_0028b0bd:
      Abc_Print(-2,"usage: &gprove [-GS num] [-vh]\n");
      Abc_Print(-2,"\t         proves multi-output testcase by splitting outputs into groups\n");
      Abc_Print(-2,
                "\t         (currently, group size more than one works only for \"bmc3\" and \"pdr\")\n"
               );
      Abc_Print(-2,"\t-G num : the size of one group [default = %d]\n",(ulong)nGroupSize);
      pcVar2 = "none";
      if (local_40 != (char *)0x0) {
        pcVar2 = local_40;
      }
      Abc_Print(-2,"\t-S str : the command line to be executed for each group [default = %s]\n",
                pcVar2);
      pcVar2 = "yes";
      if (local_44 == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      pcVar2 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_0028b167:
      Abc_Print(iVar3,pcVar2);
      return 1;
    }
  }
  pcVar2 = "Command line switch \"-G\" should be followed by an integer.\n";
LAB_0028b0b1:
  Abc_Print(-1,pcVar2);
  goto LAB_0028b0bd;
}

Assistant:

int Abc_CommandAbc9GroupProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Gia_ManGroupProve( Gia_Man_t * p, char * pCommLine, int nGroupSize, int fVerbose );
    Vec_Int_t * vStatus;
    char * pCommLine = NULL;
    int c, nGroupSize = 1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "GSvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            nGroupSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nGroupSize <= 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a file name.\n" );
                goto usage;
            }
            pCommLine = argv[globalUtilOptind];
            globalUtilOptind++;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GroupProve(): There is no AIG.\n" );
        return 1;
    }
    if ( pCommLine == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GroupProve(): Command line is not given.\n" );
        return 1;
    }
    vStatus = Gia_ManGroupProve( pAbc->pGia, pCommLine, nGroupSize, fVerbose );
    Vec_IntFree( vStatus );
    return 0;

usage:
    Abc_Print( -2, "usage: &gprove [-GS num] [-vh]\n" );
    Abc_Print( -2, "\t         proves multi-output testcase by splitting outputs into groups\n" );
    Abc_Print( -2, "\t         (currently, group size more than one works only for \"bmc3\" and \"pdr\")\n" );
    Abc_Print( -2, "\t-G num : the size of one group [default = %d]\n", nGroupSize );
    Abc_Print( -2, "\t-S str : the command line to be executed for each group [default = %s]\n", pCommLine ? pCommLine : "none" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}